

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_keys.cpp
# Opt level: O2

bool __thiscall AKey::HandlePickup(AKey *this,AInventory *item)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  bool bVar1;
  int iVar2;
  PClass *pPVar3;
  PClass *pPVar4;
  AInventory *pAVar5;
  undefined8 extraout_RDX;
  TObjPtr<AInventory> *obj;
  
  if (multiplayer) {
    bVar1 = AInventory::HandlePickup(&this->super_AInventory,item);
    return bVar1;
  }
  pPVar3 = DObject::GetClass((DObject *)this);
  pPVar4 = DObject::GetClass((DObject *)item);
  if (pPVar3 == pPVar4) {
    *(byte *)&item->ItemFlags = (byte)item->ItemFlags | 4;
    bVar1 = true;
  }
  else {
    obj = &(this->super_AInventory).super_AActor.Inventory;
    pAVar5 = GC::ReadBarrier<AInventory>((AInventory **)obj);
    if (pAVar5 != (AInventory *)0x0) {
      pAVar5 = GC::ReadBarrier<AInventory>((AInventory **)obj);
      UNRECOVERED_JUMPTABLE =
           (pAVar5->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x37];
      iVar2 = (*UNRECOVERED_JUMPTABLE)(pAVar5,item,extraout_RDX,UNRECOVERED_JUMPTABLE);
      return SUB41(iVar2,0);
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool AKey::HandlePickup (AInventory *item)
{
	// In single player, you can pick up an infinite number of keys
	// even though you can only hold one of each.
	if (multiplayer)
	{
		return Super::HandlePickup (item);
	}
	if (GetClass() == item->GetClass())
	{
		item->ItemFlags |= IF_PICKUPGOOD;
		return true;
	}
	if (Inventory != NULL)
	{
		return Inventory->HandlePickup (item);
	}
	return false;
}